

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

uint * getRevealedNodes(tree_t *tree,uint16_t *hideList,size_t hideListSize,size_t *outputSize)

{
  uint *list;
  _Bool _Var1;
  size_t i;
  void *__ptr;
  size_t sVar2;
  uint *list_00;
  bitset_word_t bVar3;
  ulong uVar4;
  uint uVar5;
  uint node;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  size_t i_1;
  uint local_6c;
  
  uVar8 = (ulong)(tree->depth - 1);
  __ptr = calloc(uVar8 * hideListSize,4);
  for (sVar2 = 0; sVar2 != hideListSize; sVar2 = sVar2 + 1) {
    iVar7 = tree->numNodes - tree->numLeaves;
    uVar4 = (ulong)(iVar7 + 1 + (uint)hideList[sVar2]);
    uVar6 = 1;
    *(uint *)((long)__ptr + sVar2 * 4) = iVar7 + (uint)hideList[sVar2];
    while( true ) {
      uVar4 = uVar4 >> 1;
      iVar7 = (int)uVar4 + -1;
      if (iVar7 == 0) break;
      lVar9 = uVar6 * hideListSize;
      uVar6 = (ulong)((int)uVar6 + 1);
      *(int *)((long)__ptr + lVar9 * 4 + sVar2 * 4) = iVar7;
    }
  }
  list_00 = (uint *)malloc((ulong)tree->numLeaves << 2);
  uVar4 = 0;
  local_6c = 0;
  do {
    if (uVar4 == uVar8) {
      free(__ptr);
      *outputSize = (ulong)local_6c;
      return list_00;
    }
    list = (uint *)((long)__ptr + uVar4 * hideListSize * 4);
    for (sVar2 = 0; sVar2 != hideListSize; sVar2 = sVar2 + 1) {
      uVar5 = list[sVar2];
      bVar3 = exists(tree,uVar5);
      if (bVar3 != 0) {
        if ((uVar5 & 1) == 0) {
          uVar5 = uVar5 - 1;
        }
        else {
          uVar5 = uVar5 + 1;
          bVar3 = exists(tree,uVar5);
          if (bVar3 == 0) goto LAB_0011c623;
          if (tree->numNodes <= uVar5) {
            uVar5 = 0;
          }
        }
        _Var1 = contains(list,hideListSize,uVar5);
        if (!_Var1) {
          do {
            node = uVar5;
            _Var1 = hasRightChild(tree,node);
            if (_Var1) break;
            uVar5 = node * 2 + 1;
          } while (uVar5 < tree->numNodes);
          uVar6 = (ulong)local_6c;
          _Var1 = contains(list_00,uVar6,node);
          if (!_Var1) {
            local_6c = local_6c + 1;
            list_00[uVar6] = node;
          }
        }
      }
LAB_0011c623:
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static unsigned int* getRevealedNodes(tree_t* tree, uint16_t* hideList, size_t hideListSize,
                                      size_t* outputSize) {
  /* Compute paths up from hideList to root, store as sets of nodes */
  const unsigned int pathLen = tree->depth - 1;

  /* pathSets[i][0...hideListSize] ~= pathSets[i * hideListSize + ...] stores the nodes in the path
   * at depth i for each of the leaf nodes in hideListSize */
  unsigned int* pathSets = calloc(hideListSize * pathLen, sizeof(unsigned int));

  /* Compute the paths back to the root */
  for (size_t i = 0; i < hideListSize; i++) {
    /* input lists leaf indexes, translate to nodes */
    unsigned int node                    = hideList[i] + (tree->numNodes - tree->numLeaves);
    pathSets[/* 0 * hideListSize + */ i] = node;
    unsigned int pos                     = 1;
    while ((node = getParent(node)) != 0) {
      pathSets[pos * hideListSize + i] = node;
      pos++;
    }
  }

  /* Determine seeds to reveal */
  unsigned int* revealed   = malloc(tree->numLeaves * sizeof(unsigned int));
  unsigned int revealedPos = 0;
  for (unsigned int d = 0; d < pathLen; d++) {
    for (size_t i = 0; i < hideListSize; i++) {
      unsigned int node = pathSets[d * hideListSize + i];
      if (!hasSibling(tree, node)) {
        continue;
      }
      unsigned int sibling = getSibling(tree, node);
      if (!contains(&pathSets[d * hideListSize], hideListSize, sibling)) {
        // Determine the seed to reveal
        while (!hasRightChild(tree, sibling) && !isLeafNode(tree, sibling)) {
          sibling = 2 * sibling + 1; // sibling = leftChild(sibling)
        }
        // Only reveal if we haven't already
        if (!contains(revealed, revealedPos, sibling)) {
          revealed[revealedPos] = sibling;
          revealedPos++;
        }
      }
    }
  }

  free(pathSets);

  *outputSize = revealedPos;
  return revealed;
}